

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavUpdateWindowingOverlay(void)

{
  char *pcVar1;
  bool bVar2;
  ImGuiWindow *pIVar3;
  ImGuiWindow **ppIVar4;
  char *pcVar5;
  ImVec2 local_60;
  char *local_58;
  char *label;
  ImGuiWindow *window;
  ImVec2 IStack_40;
  int n;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  ImVec2 local_20;
  ImGuiViewport *local_18;
  ImGuiViewport *viewport;
  ImGuiContext *g;
  
  viewport = (ImGuiViewport *)GImGui;
  if (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0) {
    __assert_fail("g.NavWindowingTarget != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                  ,0x25fa,"void ImGui::NavUpdateWindowingOverlay()");
  }
  if (0.15 < GImGui->NavWindowingTimer || GImGui->NavWindowingTimer == 0.15) {
    if (GImGui->NavWindowingListWindow == (ImGuiWindow *)0x0) {
      pIVar3 = FindWindowByName("###NavWindowingList");
      *(ImGuiWindow **)&viewport[0xdc].WorkPos.y = pIVar3;
    }
    local_18 = GetMainViewport();
    ImVec2::ImVec2(&local_20,(local_18->Size).x * 0.2,(local_18->Size).y * 0.2);
    ImVec2::ImVec2(&local_28,3.4028235e+38,3.4028235e+38);
    SetNextWindowSizeConstraints(&local_20,&local_28,(ImGuiSizeCallback)0x0,(void *)0x0);
    local_30 = ImGuiViewport::GetCenter(local_18);
    ImVec2::ImVec2(&local_38,0.5,0.5);
    SetNextWindowPos(&local_30,1,&local_38);
    IStack_40 = ::operator*(&viewport[0x98].Pos,2.0);
    PushStyleVar(1,&stack0xffffffffffffffc0);
    Begin("###NavWindowingList",(bool *)0x0,0xc1347);
    window._4_4_ = viewport[0xc5].Size.x;
    while (window._4_4_ = (float)((int)window._4_4_ + -1), -1 < (int)window._4_4_) {
      ppIVar4 = ImVector<ImGuiWindow_*>::operator[]
                          ((ImVector<ImGuiWindow_*> *)&viewport[0xc5].Size,(int)window._4_4_);
      label = (char *)*ppIVar4;
      if ((ImGuiWindow *)label == (ImGuiWindow *)0x0) {
        __assert_fail("window != __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                      ,0x2609,"void ImGui::NavUpdateWindowingOverlay()");
      }
      bVar2 = IsWindowNavFocusable((ImGuiWindow *)label);
      if (bVar2) {
        pcVar1 = *(char **)label;
        local_58 = pcVar1;
        pcVar5 = FindRenderedTextEnd(pcVar1,(char *)0x0);
        if (pcVar1 == pcVar5) {
          local_58 = GetFallbackWindowNameForWindowingList((ImGuiWindow *)label);
        }
        pcVar1 = local_58;
        bVar2 = *(char **)&viewport[0xdc].Pos.y == label;
        ImVec2::ImVec2(&local_60,0.0,0.0);
        Selectable(pcVar1,bVar2,0,&local_60);
      }
    }
    End();
    PopStyleVar(1);
  }
  return;
}

Assistant:

void ImGui::NavUpdateWindowingOverlay()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.NavWindowingTarget != NULL);

    if (g.NavWindowingTimer < NAV_WINDOWING_LIST_APPEAR_DELAY)
        return;

    if (g.NavWindowingListWindow == NULL)
        g.NavWindowingListWindow = FindWindowByName("###NavWindowingList");
    const ImGuiViewport* viewport = GetMainViewport();
    SetNextWindowSizeConstraints(ImVec2(viewport->Size.x * 0.20f, viewport->Size.y * 0.20f), ImVec2(FLT_MAX, FLT_MAX));
    SetNextWindowPos(viewport->GetCenter(), ImGuiCond_Always, ImVec2(0.5f, 0.5f));
    PushStyleVar(ImGuiStyleVar_WindowPadding, g.Style.WindowPadding * 2.0f);
    Begin("###NavWindowingList", NULL, ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoFocusOnAppearing | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoInputs | ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoSavedSettings);
    for (int n = g.WindowsFocusOrder.Size - 1; n >= 0; n--)
    {
        ImGuiWindow* window = g.WindowsFocusOrder[n];
        IM_ASSERT(window != NULL); // Fix static analyzers
        if (!IsWindowNavFocusable(window))
            continue;
        const char* label = window->Name;
        if (label == FindRenderedTextEnd(label))
            label = GetFallbackWindowNameForWindowingList(window);
        Selectable(label, g.NavWindowingTarget == window);
    }
    End();
    PopStyleVar();
}